

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::StartParseFile(Parser *this,char *source,char *source_filename)

{
  bool bVar1;
  char *in_RCX;
  char *local_90;
  allocator<char> local_69;
  string local_68 [39];
  byte local_41;
  uint local_40;
  byte local_29;
  char *source_filename_local;
  char *source_local;
  Parser *this_local;
  CheckedError *ce;
  
  local_90 = in_RCX;
  if (in_RCX == (char *)0x0) {
    local_90 = "";
  }
  source_filename_local = source_filename;
  source_local = source;
  this_local = this;
  std::__cxx11::string::operator=((string *)(source + 0x708),local_90);
  *(char **)(source + 0x728) = source_filename_local;
  ParserState::ResetState((ParserState *)source,*(char **)(source + 0x728));
  std::__cxx11::string::clear();
  local_29 = 0;
  SkipByteOrderMark(this);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (bVar1) {
    local_29 = 1;
  }
  local_40 = (uint)bVar1;
  if ((local_29 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (local_40 == 0) {
    local_41 = 0;
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (bVar1) {
      local_41 = 1;
    }
    local_40 = (uint)bVar1;
    if ((local_41 & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (local_40 == 0) {
      bVar1 = Is((Parser *)source,0x100);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_68,"input file is empty",&local_69)
        ;
        Error(this,(string *)source);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator(&local_69);
      }
      else {
        anon_unknown_0::NoError();
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::StartParseFile(const char *source,
                                    const char *source_filename) {
  file_being_parsed_ = source_filename ? source_filename : "";
  source_ = source;
  ResetState(source_);
  error_.clear();
  ECHECK(SkipByteOrderMark());
  NEXT();
  if (Is(kTokenEof)) return Error("input file is empty");
  return NoError();
}